

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vgbm(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  TCGContext_conflict12 *s_00;
  int i;
  long lVar3;
  TCGTemp *a1;
  byte bVar4;
  ulong uVar5;
  int i_2;
  uint uVar6;
  uint64_t r;
  ulong uVar7;
  uintptr_t o_1;
  TCGv_i64 src;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 >> 0x12 & 1) != 0) {
    s_00 = s->uc->tcg_ctx;
    uVar2 = (s->fields).c[1];
    uVar6 = uVar2 & 0xff;
    if ((uVar2 & 0xffff) == (uVar6 << 8 | uVar6)) {
      if ((uVar1 >> 0x16 & 1) != 0) {
        uVar1 = (s->fields).c[0];
        if ((uVar1 & 0xe0) == 0) {
          bVar4 = 0;
          lVar3 = 0;
          uVar7 = 0;
          do {
            uVar5 = 0;
            if ((uVar6 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
              uVar5 = 0xffL << (bVar4 & 0x3f);
            }
            uVar7 = uVar7 | uVar5;
            lVar3 = lVar3 + 1;
            bVar4 = bVar4 + 8;
          } while (lVar3 != 8);
          tcg_gen_gvec_dup64i_s390x(s_00,(uVar1 & 0x1f) * 0x10 + 0x80,0x10,0x10,uVar7);
          return DISAS_NEXT;
        }
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                   ,0xdf,"reg < 32");
      }
    }
    else {
      bVar4 = 0;
      a1 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
      src = (TCGv_i64)((long)a1 - (long)s_00);
      lVar3 = 0;
      uVar7 = 0;
      do {
        uVar5 = 0;
        if (((uVar2 >> 8 & 0xff) >> ((uint)lVar3 & 0x1f) & 1) != 0) {
          uVar5 = 0xffL << (bVar4 & 0x3f);
        }
        uVar7 = uVar7 | uVar5;
        lVar3 = lVar3 + 1;
        bVar4 = bVar4 + 8;
      } while (lVar3 != 8);
      tcg_gen_op2_s390x(s_00,INDEX_op_movi_i64,(TCGArg)a1,uVar7);
      if (((s->fields).presentO & 0x400000) != 0) {
        bVar4 = 0;
        write_vec_element_i64(s_00,src,(s->fields).c[0],'\0',MO_64);
        lVar3 = 0;
        uVar7 = 0;
        do {
          uVar5 = 0;
          if ((uVar6 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
            uVar5 = 0xffL << (bVar4 & 0x3f);
          }
          uVar7 = uVar7 | uVar5;
          lVar3 = lVar3 + 1;
          bVar4 = bVar4 + 8;
        } while (lVar3 != 8);
        tcg_gen_op2_s390x(s_00,INDEX_op_movi_i64,(TCGArg)a1,uVar7);
        if (((s->fields).presentO & 0x400000) != 0) {
          write_vec_element_i64(s_00,src,(s->fields).c[0],'\x01',MO_64);
          tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(src + (long)s_00));
          return DISAS_NEXT;
        }
      }
    }
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vgbm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint16_t i2 = get_field(s, i2);

    if (i2 == (i2 & 0xff) * 0x0101) {
        /*
         * Masks for both 64 bit elements of the vector are the same.
         * Trust tcg to produce a good constant loading.
         */
        gen_gvec_dup64i(tcg_ctx, get_field(s, v1),
                        generate_byte_mask(i2 & 0xff));
    } else {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_movi_i64(tcg_ctx, t, generate_byte_mask(i2 >> 8));
        write_vec_element_i64(tcg_ctx, t, get_field(s, v1), 0, ES_64);
        tcg_gen_movi_i64(tcg_ctx, t, generate_byte_mask(i2));
        write_vec_element_i64(tcg_ctx, t, get_field(s, v1), 1, ES_64);
        tcg_temp_free_i64(tcg_ctx, t);
    }
    return DISAS_NEXT;
}